

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O0

bool __thiscall llvm::DWARFFormValue::isFormClass(DWARFFormValue *this,FormClass FC)

{
  Form FVar1;
  uint16_t uVar2;
  size_t sVar3;
  bool bVar4;
  bool local_51;
  ArrayRef<llvm::DWARFFormValue::FormClass> local_30;
  FormClass local_1c;
  DWARFFormValue *pDStack_18;
  FormClass FC_local;
  DWARFFormValue *this_local;
  
  FVar1 = this->Form;
  local_1c = FC;
  pDStack_18 = this;
  local_30 = makeArrayRef<llvm::DWARFFormValue::FormClass,45ul>(&DWARF5FormClasses);
  sVar3 = ArrayRef<llvm::DWARFFormValue::FormClass>::size(&local_30);
  bVar4 = false;
  if (FVar1 < sVar3) {
    bVar4 = DWARF5FormClasses[this->Form] == local_1c;
  }
  if (bVar4) {
    this_local._7_1_ = true;
  }
  else {
    switch(this->Form) {
    case DW_FORM_GNU_addr_index:
      this_local._7_1_ = local_1c == FC_Address;
      break;
    case DW_FORM_GNU_str_index:
    case DW_FORM_GNU_strp_alt:
      this_local._7_1_ = local_1c == FC_String;
      break;
    default:
      if (local_1c == FC_SectionOffset) {
        if ((this->Form == DW_FORM_strp) || (this->Form == DW_FORM_line_strp)) {
          return true;
        }
        if ((this->Form == DW_FORM_data4) || (this->Form == DW_FORM_data8)) {
          local_51 = true;
          if (this->U != (DWARFUnit *)0x0) {
            uVar2 = DWARFUnit::getVersion(this->U);
            local_51 = uVar2 < 4;
          }
          return local_51;
        }
      }
      this_local._7_1_ = false;
      break;
    case DW_FORM_GNU_ref_alt:
      this_local._7_1_ = local_1c == FC_Reference;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DWARFFormValue::isFormClass(DWARFFormValue::FormClass FC) const {
  // First, check DWARF5 form classes.
  if (Form < makeArrayRef(DWARF5FormClasses).size() &&
      DWARF5FormClasses[Form] == FC)
    return true;
  // Check more forms from extensions and proposals.
  switch (Form) {
  case DW_FORM_GNU_ref_alt:
    return (FC == FC_Reference);
  case DW_FORM_GNU_addr_index:
    return (FC == FC_Address);
  case DW_FORM_GNU_str_index:
  case DW_FORM_GNU_strp_alt:
    return (FC == FC_String);
  default:
    break;
  }

  if (FC == FC_SectionOffset) {
    if (Form == DW_FORM_strp || Form == DW_FORM_line_strp)
      return true;
    // In DWARF3 DW_FORM_data4 and DW_FORM_data8 served also as a section
    // offset. If we don't have a DWARFUnit, default to the old behavior.
    if (Form == DW_FORM_data4 || Form == DW_FORM_data8)
      return !U || U->getVersion() <= 3;
  }

  return false;
}